

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O0

void X509_free(X509 *a)

{
  int iVar1;
  X509 *x509_local;
  
  if ((a != (X509 *)0x0) &&
     (iVar1 = CRYPTO_refcount_dec_and_test_zero((CRYPTO_refcount_t *)&a->valid), iVar1 != 0)) {
    CRYPTO_free_ex_data(0xace6e8,a,(CRYPTO_EX_DATA *)&a->name);
    X509_CINF_free(a->cert_info);
    X509_ALGOR_free(a->sig_alg);
    ASN1_BIT_STRING_free(a->signature);
    ASN1_OCTET_STRING_free((ASN1_OCTET_STRING *)a->ex_pcpathlen);
    AUTHORITY_KEYID_free((AUTHORITY_KEYID *)a->ex_flags);
    CRL_DIST_POINTS_free((CRL_DIST_POINTS *)a->ex_kusage);
    GENERAL_NAMES_free((GENERAL_NAMES *)a->ex_xkusage);
    NAME_CONSTRAINTS_free((NAME_CONSTRAINTS *)a->ex_nscert);
    X509_CERT_AUX_free((X509_CERT_AUX *)a->altname);
    CRYPTO_MUTEX_cleanup((CRYPTO_MUTEX *)&a->nc);
    OPENSSL_free(a);
  }
  return;
}

Assistant:

void X509_free(X509 *x509) {
  if (x509 == NULL || !CRYPTO_refcount_dec_and_test_zero(&x509->references)) {
    return;
  }

  CRYPTO_free_ex_data(&g_ex_data_class, x509, &x509->ex_data);

  X509_CINF_free(x509->cert_info);
  X509_ALGOR_free(x509->sig_alg);
  ASN1_BIT_STRING_free(x509->signature);
  ASN1_OCTET_STRING_free(x509->skid);
  AUTHORITY_KEYID_free(x509->akid);
  CRL_DIST_POINTS_free(x509->crldp);
  GENERAL_NAMES_free(x509->altname);
  NAME_CONSTRAINTS_free(x509->nc);
  X509_CERT_AUX_free(x509->aux);
  CRYPTO_MUTEX_cleanup(&x509->lock);

  OPENSSL_free(x509);
}